

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

void xmlFreeNsList(xmlNsPtr cur)

{
  _xmlNs *p_Var1;
  xmlNsPtr next;
  xmlNsPtr cur_local;
  
  next = cur;
  if (cur != (xmlNsPtr)0x0) {
    while (next != (xmlNsPtr)0x0) {
      p_Var1 = next->next;
      xmlFreeNs(next);
      next = p_Var1;
    }
  }
  return;
}

Assistant:

void
xmlFreeNsList(xmlNsPtr cur) {
    xmlNsPtr next;
    if (cur == NULL) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlFreeNsList : ns == NULL\n");
#endif
	return;
    }
    while (cur != NULL) {
        next = cur->next;
        xmlFreeNs(cur);
	cur = next;
    }
}